

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.hpp
# Opt level: O2

bool nlohmann::operator<(const_reference lhs,const_reference rhs)

{
  value_t lhs_00;
  value_t rhs_00;
  undefined1 auVar1 [16];
  __synth3way_t<unsigned_char> _Var2;
  bool bVar3;
  number_float_t nVar4;
  double dVar5;
  undefined1 in_ZMM0 [64];
  
  lhs_00 = lhs->m_type;
  rhs_00 = rhs->m_type;
  if (lhs_00 == rhs_00) {
    switch(lhs_00) {
    case object:
      _Var2._M_value =
           (type_conflict)
           std::operator<=>(&((lhs->m_value).object)->_M_t,&((rhs->m_value).object)->_M_t);
      break;
    case array:
      _Var2._M_value =
           (type_conflict)
           std::
           operator<=><nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>,std::allocator<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>>
                     ((vector<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
                       *)(lhs->m_value).object,
                      (vector<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
                       *)(rhs->m_value).object);
      break;
    case string:
      _Var2._M_value =
           (type_conflict)
           std::operator<=><char,std::char_traits<char>,std::allocator<char>>
                     ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      (lhs->m_value).object,
                      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      (rhs->m_value).object);
      break;
    case boolean:
      return (lhs->m_value).boolean < (rhs->m_value).boolean;
    case number_integer:
switchD_0012b5b2_caseD_5:
      return (lhs->m_value).number_integer < (rhs->m_value).number_integer;
    case number_unsigned:
      return (lhs->m_value).object < (rhs->m_value).object;
    case number_float:
      nVar4 = (lhs->m_value).number_float;
      goto LAB_0012b5dd;
    case binary:
      _Var2 = std::operator<=><unsigned_char,std::allocator<unsigned_char>>
                        ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                         (lhs->m_value).object,
                         (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                         (rhs->m_value).object);
      break;
    default:
      return false;
    }
    return (bool)((byte)_Var2._M_value >> 7);
  }
  if (lhs_00 != number_integer || (rhs_00 ^ number_float) != null) {
    if (lhs_00 == number_float && (rhs_00 ^ number_integer) == null) {
      dVar5 = (double)(rhs->m_value).number_integer;
    }
    else {
      if (lhs_00 == number_unsigned && (rhs_00 ^ number_float) == null) {
        auVar1 = vcvtusi2sd_avx512f(in_ZMM0._0_16_,(lhs->m_value).object);
        nVar4 = auVar1._0_8_;
        goto LAB_0012b5dd;
      }
      if (lhs_00 != number_float || (rhs_00 ^ number_unsigned) != null) {
        if ((lhs_00 != number_integer || (rhs_00 ^ number_unsigned) != null) &&
           (lhs_00 != number_unsigned || (rhs_00 ^ number_integer) != null)) {
          bVar3 = detail::operator<(lhs_00,rhs_00);
          return bVar3;
        }
        goto switchD_0012b5b2_caseD_5;
      }
      auVar1 = vcvtusi2sd_avx512f(in_ZMM0._0_16_,(rhs->m_value).object);
      dVar5 = auVar1._0_8_;
    }
    return (lhs->m_value).number_float < dVar5;
  }
  nVar4 = (number_float_t)(lhs->m_value).number_integer;
LAB_0012b5dd:
  return nVar4 < (rhs->m_value).number_float;
}

Assistant:

friend bool operator<(const_reference lhs, const_reference rhs) noexcept
    {
        const auto lhs_type = lhs.type();
        const auto rhs_type = rhs.type();

        if (lhs_type == rhs_type)
        {
            switch (lhs_type)
            {
                case value_t::array:
                    // note parentheses are necessary, see
                    // https://github.com/nlohmann/json/issues/1530
                    return (*lhs.m_value.array) < (*rhs.m_value.array);

                case value_t::object:
                    return (*lhs.m_value.object) < (*rhs.m_value.object);

                case value_t::null:
                    return false;

                case value_t::string:
                    return (*lhs.m_value.string) < (*rhs.m_value.string);

                case value_t::boolean:
                    return (lhs.m_value.boolean) < (rhs.m_value.boolean);

                case value_t::number_integer:
                    return (lhs.m_value.number_integer) < (rhs.m_value.number_integer);

                case value_t::number_unsigned:
                    return (lhs.m_value.number_unsigned) < (rhs.m_value.number_unsigned);

                case value_t::number_float:
                    return (lhs.m_value.number_float) < (rhs.m_value.number_float);

                case value_t::binary:
                    return (*lhs.m_value.binary) < (*rhs.m_value.binary);

                case value_t::discarded:
                default:
                    return false;
            }
        }
        else if (lhs_type == value_t::number_integer && rhs_type == value_t::number_float)
        {
            return static_cast<number_float_t>(lhs.m_value.number_integer) < rhs.m_value.number_float;
        }
        else if (lhs_type == value_t::number_float && rhs_type == value_t::number_integer)
        {
            return lhs.m_value.number_float < static_cast<number_float_t>(rhs.m_value.number_integer);
        }
        else if (lhs_type == value_t::number_unsigned && rhs_type == value_t::number_float)
        {
            return static_cast<number_float_t>(lhs.m_value.number_unsigned) < rhs.m_value.number_float;
        }
        else if (lhs_type == value_t::number_float && rhs_type == value_t::number_unsigned)
        {
            return lhs.m_value.number_float < static_cast<number_float_t>(rhs.m_value.number_unsigned);
        }
        else if (lhs_type == value_t::number_integer && rhs_type == value_t::number_unsigned)
        {
            return lhs.m_value.number_integer < static_cast<number_integer_t>(rhs.m_value.number_unsigned);
        }
        else if (lhs_type == value_t::number_unsigned && rhs_type == value_t::number_integer)
        {
            return static_cast<number_integer_t>(lhs.m_value.number_unsigned) < rhs.m_value.number_integer;
        }

        // We only reach this line if we cannot compare values. In that case,
        // we compare types. Note we have to call the operator explicitly,
        // because MSVC has problems otherwise.
        return operator<(lhs_type, rhs_type);
    }